

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_SwapFieldsAll_Test::
GeneratedMessageReflectionSwapTest_SwapFieldsAll_Test
          (GeneratedMessageReflectionSwapTest_SwapFieldsAll_Test *this)

{
  GeneratedMessageReflectionSwapTest_SwapFieldsAll_Test *this_local;
  
  GeneratedMessageReflectionSwapTest::GeneratedMessageReflectionSwapTest
            (&this->super_GeneratedMessageReflectionSwapTest);
  (this->super_GeneratedMessageReflectionSwapTest).super_TestWithParam<bool>.super_Test._vptr_Test =
       (_func_int **)&PTR__GeneratedMessageReflectionSwapTest_SwapFieldsAll_Test_029c8500;
  (this->super_GeneratedMessageReflectionSwapTest).super_TestWithParam<bool>.
  super_WithParamInterface<bool>._vptr_WithParamInterface = (_func_int **)&DAT_029c8540;
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, SwapFieldsAll) {
  std::unique_ptr<unittest::TestAllTypes> lhs(
      Arena::Create<unittest::TestAllTypes>(nullptr));
  std::unique_ptr<unittest::TestAllTypes> rhs(
      Arena::Create<unittest::TestAllTypes>(nullptr));

  TestUtil::SetAllFields(rhs.get());

  std::vector<const FieldDescriptor*> fields;
  const Reflection* reflection = lhs->GetReflection();
  reflection->ListFields(*rhs, &fields);
  SwapFields(reflection, lhs.get(), rhs.get(), fields);

  TestUtil::ExpectAllFieldsSet(*lhs);
  TestUtil::ExpectClear(*rhs);
}